

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O0

void __thiscall flow::Instr::addOperand(Instr *this,Value *value)

{
  BasicBlock *this_00;
  BasicBlock *local_38;
  BasicBlock *newBB;
  Value *value_local;
  Instr *this_local;
  
  newBB = (BasicBlock *)value;
  value_local = &this->super_Value;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::push_back
            (&this->operands_,(value_type *)&newBB);
  Value::addUse(&newBB->super_Value,this);
  if (newBB == (BasicBlock *)0x0) {
    local_38 = (BasicBlock *)0x0;
  }
  else {
    local_38 = (BasicBlock *)__dynamic_cast(newBB,&Value::typeinfo,&BasicBlock::typeinfo,0);
  }
  if (local_38 != (BasicBlock *)0x0) {
    this_00 = getBasicBlock(this);
    BasicBlock::linkSuccessor(this_00,local_38);
  }
  return;
}

Assistant:

void Instr::addOperand(Value* value) {
  operands_.push_back(value);

  value->addUse(this);

  if (BasicBlock* newBB = dynamic_cast<BasicBlock*>(value)) {
    getBasicBlock()->linkSuccessor(newBB);
  }
}